

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteStateMachine.hpp
# Opt level: O2

shared_ptr<peach::fsm::Node> __thiscall
peach::fsm::Node::addTransitionToNewNode<peach::transition::SingleCharTransition,char_const&>
          (Node *this,tokenCategory_t category,char *args)

{
  char *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<peach::fsm::Node> sVar1;
  __shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  char *local_28;
  
  local_28 = args;
  std::make_shared<peach::fsm::Node,unsigned_long&>((unsigned_long *)this);
  std::__shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,(__shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2> *)this);
  addTransition<peach::transition::SingleCharTransition,char_const&>
            ((Node *)category,(shared_ptr<peach::fsm::Node> *)&_Stack_38,in_RCX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  sVar1.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<peach::fsm::Node>)
         sVar1.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> addTransitionToNewNode(token::tokenCategory_t category, TransitionArgs &&... args)
    {
        auto newNode = std::make_shared<Node>(category);
        addTransition<Transition>(newNode, std::forward<TransitionArgs>(args)...);
        return newNode;
    }